

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc_helper.c
# Opt level: O0

void helper_outl_x86_64(CPUX86State *env,uint32_t port,uint32_t data)

{
  uint32_t data_local;
  uint32_t port_local;
  CPUX86State *env_local;
  
  cpu_outl_x86_64(env->uc,port,data);
  return;
}

Assistant:

void helper_outl(CPUX86State *env, uint32_t port, uint32_t data)
{
// #ifdef UNICORN_ARCH_POSTFIX
//     glue(address_space_stl, UNICORN_ARCH_POSTFIX)(env->uc, &env->uc->address_space_io, port, data,
// #else
//     address_space_stl(env->uc, &env->uc->address_space_io, port, data,
// #endif
//                       cpu_get_mem_attrs(env), NULL);
    return cpu_outl(env->uc, port, data);
}